

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall
QCommonListViewBase::horizontalScrollToValue
          (QCommonListViewBase *this,int param_2,ScrollHint hint,bool leftOf,bool rightOf,
          QRect *area,QRect *rect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  byte in_CL;
  int in_EDX;
  byte in_R8B;
  long in_FS_OFFSET;
  int horizontalValue;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_3c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  horizontalScrollBar((QCommonListViewBase *)0x88117c);
  local_3c = QAbstractSlider::value
                       ((QAbstractSlider *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  bVar1 = isRightToLeft((QCommonListViewBase *)0x881192);
  if (bVar1) {
    if (in_EDX == 3) {
      iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      iVar3 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      iVar4 = QRect::left((QRect *)0x8811d8);
      local_3c = ((iVar2 - iVar3) / 2 - iVar4) + local_3c;
    }
    else if ((in_CL & 1) == 0) {
      if ((in_R8B & 1) != 0) {
        local_c = QRect::left((QRect *)0x88121a);
        iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
        ;
        local_10 = QRect::right((QRect *)0x881236);
        local_10 = iVar2 - local_10;
        piVar5 = qMin<int>(&local_c,&local_10);
        local_3c = *piVar5 + local_3c;
      }
    }
    else {
      iVar2 = QRect::left((QRect *)0x8811fb);
      local_3c = local_3c - iVar2;
    }
  }
  else if (in_EDX == 3) {
    iVar2 = QRect::left((QRect *)0x881275);
    iVar3 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar4 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_3c = (iVar2 - (iVar3 - iVar4) / 2) + local_3c;
  }
  else if ((in_CL & 1) == 0) {
    if ((in_R8B & 1) != 0) {
      local_14 = QRect::left((QRect *)0x8812df);
      iVar2 = QRect::right((QRect *)0x8812ed);
      local_18 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                             );
      local_18 = iVar2 - local_18;
      piVar5 = qMin<int>(&local_14,&local_18);
      local_3c = *piVar5 + local_3c;
    }
  }
  else {
    iVar2 = QRect::left((QRect *)0x8812c4);
    local_3c = iVar2 + local_3c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

int QCommonListViewBase::horizontalScrollToValue(const int /*index*/, QListView::ScrollHint hint,
                                            bool leftOf, bool rightOf, const QRect &area, const QRect &rect) const
{
    int horizontalValue = horizontalScrollBar()->value();
    if (isRightToLeft()) {
        if (hint == QListView::PositionAtCenter) {
            horizontalValue += ((area.width() - rect.width()) / 2) - rect.left();
        } else {
            if (leftOf)
                horizontalValue -= rect.left();
            else if (rightOf)
                horizontalValue += qMin(rect.left(), area.width() - rect.right());
        }
    } else {
        if (hint == QListView::PositionAtCenter) {
            horizontalValue += rect.left() - ((area.width()- rect.width()) / 2);
        } else {
            if (leftOf)
                horizontalValue += rect.left();
            else if (rightOf)
                horizontalValue += qMin(rect.left(), rect.right() - area.width());
        }
    }
    return horizontalValue;
}